

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkMarkCone_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vFlops)

{
  ushort uVar1;
  int Id;
  int iVar2;
  Wlc_Obj_t *pObj_00;
  
  uVar1 = *(ushort *)pObj;
  if (-1 < (char)uVar1) {
    *(ushort *)pObj = uVar1 | 0x80;
    if ((uVar1 & 0x3d) == 1) {
      if ((uVar1 & 3) != 1) {
        iVar2 = Wlc_ObjCiId(pObj);
        Vec_IntPush(vFlops,iVar2);
        return;
      }
    }
    else {
      for (iVar2 = 0; iVar2 < (int)pObj->nFanins; iVar2 = iVar2 + 1) {
        Id = Wlc_ObjFaninId(pObj,iVar2);
        if (Id != 0) {
          pObj_00 = Wlc_NtkObj(p,Id);
          Wlc_NtkMarkCone_rec(p,pObj_00,vFlops);
        }
      }
    }
  }
  return;
}

Assistant:

void Wlc_NtkMarkCone_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vFlops )
{
    int i, iFanin;
    if ( pObj->Mark )
        return;
    pObj->Mark = 1;
    if ( Wlc_ObjIsCi(pObj) )
    {
        if ( !Wlc_ObjIsPi(pObj) )
            Vec_IntPush( vFlops, Wlc_ObjCiId(pObj) );
        return;
    }
    Wlc_ObjForEachFanin( pObj, iFanin, i ) if ( iFanin )
        Wlc_NtkMarkCone_rec( p, Wlc_NtkObj(p, iFanin), vFlops );
}